

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O0

Vec_Ptr_t * Abc_NtkComputeSupportsSmart(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Supp_Man_t *p_00;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Vec_Int_t *p_03;
  int local_4c;
  int i;
  Abc_Obj_t *pObj;
  Supp_One_t *pPart1;
  Supp_One_t *pPart0;
  Supp_Man_t *p;
  Vec_Int_t *vSupp;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vSupports;
  Abc_Ntk_t *pNtk_local;
  
  for (local_4c = 0; iVar1 = Abc_NtkCiNum(pNtk), local_4c < iVar1; local_4c = local_4c + 1) {
    pAVar2 = Abc_NtkCi(pNtk,local_4c);
    pAVar2->pNext = (Abc_Obj_t *)(long)local_4c;
  }
  for (local_4c = 0; iVar1 = Abc_NtkCoNum(pNtk), local_4c < iVar1; local_4c = local_4c + 1) {
    pAVar2 = Abc_NtkCo(pNtk,local_4c);
    pAVar2->pNext = (Abc_Obj_t *)(long)local_4c;
  }
  p_00 = Supp_ManStart(0x100000,0x40);
  iVar1 = Abc_NtkCoNum(pNtk);
  p_01 = Vec_PtrAlloc(iVar1);
  Abc_NtkCleanCopy(pNtk);
  p_02 = Abc_NtkDfsNatural(pNtk);
  local_4c = 0;
  do {
    iVar1 = Vec_PtrSize(p_02);
    if (iVar1 <= local_4c) {
      Vec_PtrFree(p_02);
      Supp_ManStop(p_00);
      Vec_VecSort((Vec_Vec_t *)p_01,1);
      for (local_4c = 0; iVar1 = Abc_NtkCiNum(pNtk), local_4c < iVar1; local_4c = local_4c + 1) {
        pAVar2 = Abc_NtkCi(pNtk,local_4c);
        pAVar2->pNext = (Abc_Obj_t *)0x0;
      }
      for (local_4c = 0; iVar1 = Abc_NtkCoNum(pNtk), local_4c < iVar1; local_4c = local_4c + 1) {
        pAVar2 = Abc_NtkCo(pNtk,local_4c);
        pAVar2->pNext = (Abc_Obj_t *)0x0;
      }
      return p_01;
    }
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p_02,local_4c);
    iVar1 = Abc_ObjIsNode(pAVar2);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjIsCo(pAVar2);
      if (iVar1 == 0) {
        iVar1 = Abc_ObjIsCi(pAVar2);
        if (iVar1 == 0) {
          pAVar3 = Abc_AigConst1(pNtk);
          if (pAVar2 != pAVar3) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcPart.c"
                          ,0x181,"Vec_Ptr_t *Abc_NtkComputeSupportsSmart(Abc_Ntk_t *)");
          }
          iVar1 = Abc_ObjFanoutNum(pAVar2);
          if (iVar1 != 0) {
            iVar1 = Abc_ObjFanoutNum(pAVar2);
            pAVar3 = (Abc_Obj_t *)Supp_ManFetchEntry(p_00,0,iVar1);
            (pAVar2->field_6).pCopy = pAVar3;
          }
        }
        else {
          iVar1 = Abc_ObjFanoutNum(pAVar2);
          if (iVar1 != 0) {
            iVar1 = Abc_ObjFanoutNum(pAVar2);
            pAVar4 = (Abc_Obj_t *)Supp_ManFetchEntry(p_00,1,iVar1);
            pAVar3 = pAVar2->pNext;
            iVar1 = *(int *)((long)&pAVar4->pNtk + 4);
            *(int *)((long)&pAVar4->pNtk + 4) = iVar1 + 1;
            *(int *)((long)&pAVar4->pNext + (long)iVar1 * 4 + 4) = (int)pAVar3;
            (pAVar2->field_6).pCopy = pAVar4;
          }
        }
      }
      else {
        pAVar3 = Abc_ObjFanin0(pAVar2);
        pAVar3 = (pAVar3->field_6).pCopy;
        pAVar4 = Abc_ObjFanin0(pAVar2);
        iVar1 = Abc_ObjIsNode(pAVar4);
        if (iVar1 != 0) {
          p_03 = Supp_ManTransferEntry((Supp_One_t *)pAVar3);
          Vec_IntPush(p_03,(int)pAVar2->pNext);
          Vec_PtrPush(p_01,p_03);
        }
        if (*(int *)&pAVar3->pNtk < 1) {
          __assert_fail("pPart0->nRefs > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcPart.c"
                        ,0x16c,"Vec_Ptr_t *Abc_NtkComputeSupportsSmart(Abc_Ntk_t *)");
        }
        iVar1 = *(int *)&pAVar3->pNtk + -1;
        *(int *)&pAVar3->pNtk = iVar1;
        if (iVar1 == 0) {
          Supp_ManRecycleEntry(p_00,(Supp_One_t *)pAVar3);
        }
      }
    }
    else {
      pAVar3 = Abc_ObjFanin0(pAVar2);
      pAVar3 = (pAVar3->field_6).pCopy;
      pAVar4 = Abc_ObjFanin1(pAVar2);
      pAVar4 = (pAVar4->field_6).pCopy;
      iVar1 = Abc_ObjFanoutNum(pAVar2);
      pAVar5 = (Abc_Obj_t *)Supp_ManMergeEntry(p_00,(Supp_One_t *)pAVar3,(Supp_One_t *)pAVar4,iVar1)
      ;
      (pAVar2->field_6).pCopy = pAVar5;
      if (*(int *)&pAVar3->pNtk < 1) {
        __assert_fail("pPart0->nRefs > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcPart.c"
                      ,0x15a,"Vec_Ptr_t *Abc_NtkComputeSupportsSmart(Abc_Ntk_t *)");
      }
      iVar1 = *(int *)&pAVar3->pNtk + -1;
      *(int *)&pAVar3->pNtk = iVar1;
      if (iVar1 == 0) {
        Supp_ManRecycleEntry(p_00,(Supp_One_t *)pAVar3);
      }
      if (*(int *)&pAVar4->pNtk < 1) {
        __assert_fail("pPart1->nRefs > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcPart.c"
                      ,0x15d,"Vec_Ptr_t *Abc_NtkComputeSupportsSmart(Abc_Ntk_t *)");
      }
      iVar1 = *(int *)&pAVar4->pNtk + -1;
      *(int *)&pAVar4->pNtk = iVar1;
      if (iVar1 == 0) {
        Supp_ManRecycleEntry(p_00,(Supp_One_t *)pAVar4);
      }
    }
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Abc_NtkComputeSupportsSmart( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vSupports;
    Vec_Ptr_t * vNodes;
    Vec_Int_t * vSupp;
    Supp_Man_t * p;
    Supp_One_t * pPart0, * pPart1;
    Abc_Obj_t * pObj;
    int i;
    // set the number of PIs/POs
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pNext = (Abc_Obj_t *)(ABC_PTRINT_T)i;
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->pNext = (Abc_Obj_t *)(ABC_PTRINT_T)i;
    // start the support computation manager
    p = Supp_ManStart( 1 << 20, 1 << 6 );
    // consider objects in the topological order
    vSupports = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkCleanCopy(pNtk);
    // order the nodes so that the PIs and POs follow naturally
    vNodes = Abc_NtkDfsNatural( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        if ( Abc_ObjIsNode(pObj) )
        {
            pPart0 = (Supp_One_t *)Abc_ObjFanin0(pObj)->pCopy;
            pPart1 = (Supp_One_t *)Abc_ObjFanin1(pObj)->pCopy;
            pObj->pCopy = (Abc_Obj_t *)Supp_ManMergeEntry( p, pPart0, pPart1, Abc_ObjFanoutNum(pObj) );
            assert( pPart0->nRefs > 0 );
            if ( --pPart0->nRefs == 0 )
                Supp_ManRecycleEntry( p, pPart0 );
            assert( pPart1->nRefs > 0 );
            if ( --pPart1->nRefs == 0 )
                Supp_ManRecycleEntry( p, pPart1 );
            continue;
        }
        if ( Abc_ObjIsCo(pObj) )
        {
            pPart0 = (Supp_One_t *)Abc_ObjFanin0(pObj)->pCopy;
            // only save the CO if it is non-trivial
            if ( Abc_ObjIsNode(Abc_ObjFanin0(pObj)) )
            {
                vSupp = Supp_ManTransferEntry(pPart0);
                Vec_IntPush( vSupp, (int)(ABC_PTRINT_T)pObj->pNext );
                Vec_PtrPush( vSupports, vSupp );
            }
            assert( pPart0->nRefs > 0 );
            if ( --pPart0->nRefs == 0 )
                Supp_ManRecycleEntry( p, pPart0 );
            continue;
        }
        if ( Abc_ObjIsCi(pObj) )
        {
            if ( Abc_ObjFanoutNum(pObj) )
            {
                pPart0 = (Supp_One_t *)Supp_ManFetchEntry( p, 1, Abc_ObjFanoutNum(pObj) );
                pPart0->pOuts[ pPart0->nOuts++ ] = (int)(ABC_PTRINT_T)pObj->pNext;
                pObj->pCopy = (Abc_Obj_t *)pPart0;
            }
            continue;
        }
        if ( pObj == Abc_AigConst1(pNtk) )
        {
            if ( Abc_ObjFanoutNum(pObj) )
                pObj->pCopy = (Abc_Obj_t *)Supp_ManFetchEntry( p, 0, Abc_ObjFanoutNum(pObj) );
            continue;
        }
        assert( 0 );
    }
    Vec_PtrFree( vNodes );
//printf( "Memory usage = %d MB.\n", Vec_PtrSize(p->vMemory) * p->nChunkSize / (1<<20) );
    Supp_ManStop( p );
    // sort supports by size
    Vec_VecSort( (Vec_Vec_t *)vSupports, 1 );
    // clear the number of PIs/POs
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pNext = NULL;
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->pNext = NULL;
/*
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vSupp, i )
        printf( "%d ", Vec_IntSize(vSupp) );
    printf( "\n" );
*/
    return vSupports;
}